

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

void __thiscall
wabt::interp::FreeList<wabt::interp::Object_*>::~FreeList(FreeList<wabt::interp::Object_*> *this)

{
  Object *pOVar1;
  bool bVar2;
  reference ppOVar3;
  Object *object;
  iterator __end0;
  iterator __begin0;
  vector<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_> *__range2;
  FreeList<wabt::interp::Object_*> *this_local;
  
  __end0 = std::vector<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>::begin
                     (&this->list_);
  object = (Object *)
           std::vector<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>::end
                     (&this->list_);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end0,(__normal_iterator<wabt::interp::Object_**,_std::vector<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>_>
                                     *)&object), bVar2) {
    ppOVar3 = __gnu_cxx::
              __normal_iterator<wabt::interp::Object_**,_std::vector<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>_>
              ::operator*(&__end0);
    pOVar1 = *ppOVar3;
    if ((((ulong)pOVar1 & 1) == 0) && (pOVar1 != (Object *)0x0)) {
      (*pOVar1->_vptr_Object[1])();
    }
    __gnu_cxx::
    __normal_iterator<wabt::interp::Object_**,_std::vector<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>_>
    ::operator++(&__end0);
  }
  std::vector<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>::~vector
            (&this->list_);
  return;
}

Assistant:

FreeList<T>::~FreeList() {
  for (auto object : list_) {
    if ((reinterpret_cast<uintptr_t>(object) & ptrFreeBit) == 0) {
      delete object;
    }
  }
}